

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::MapEntryMessageComparator::operator()
          (MapEntryMessageComparator *this,Message *a,Message *b)

{
  bool bVar1;
  bool bVar2;
  CppType CVar3;
  int32_t iVar4;
  int32_t iVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  Reflection *this_00;
  int64_t iVar8;
  int64_t iVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  LogMessage *other;
  LogFinisher local_f1;
  LogMessage local_f0;
  undefined1 local_a8 [8];
  string second_5;
  string first_5;
  uint64_t second_4;
  uint64_t first_4;
  uint32_t second_3;
  uint32_t first_3;
  int64_t second_2;
  int64_t first_2;
  int32_t second_1;
  int32_t first_1;
  bool second;
  bool first;
  Reflection *reflection;
  Message *b_local;
  Message *a_local;
  MapEntryMessageComparator *this_local;
  
  this_00 = Message::GetReflection(a);
  CVar3 = FieldDescriptor::cpp_type(this->field_);
  switch(CVar3) {
  case CPPTYPE_INT32:
    iVar4 = Reflection::GetInt32(this_00,a,this->field_);
    iVar5 = Reflection::GetInt32(this_00,b,this->field_);
    this_local._7_1_ = iVar4 < iVar5;
    break;
  case CPPTYPE_INT64:
    iVar8 = Reflection::GetInt64(this_00,a,this->field_);
    iVar9 = Reflection::GetInt64(this_00,b,this->field_);
    this_local._7_1_ = iVar8 < iVar9;
    break;
  case CPPTYPE_UINT32:
    uVar6 = Reflection::GetUInt32(this_00,a,this->field_);
    uVar7 = Reflection::GetUInt32(this_00,b,this->field_);
    this_local._7_1_ = uVar6 < uVar7;
    break;
  case CPPTYPE_UINT64:
    uVar10 = Reflection::GetUInt64(this_00,a,this->field_);
    uVar11 = Reflection::GetUInt64(this_00,b,this->field_);
    this_local._7_1_ = uVar10 < uVar11;
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
               ,0x8d7);
    other = internal::LogMessage::operator<<(&local_f0,"Invalid key for map field.");
    internal::LogFinisher::operator=(&local_f1,other);
    internal::LogMessage::~LogMessage(&local_f0);
    this_local._7_1_ = true;
    break;
  case CPPTYPE_BOOL:
    bVar1 = Reflection::GetBool(this_00,a,this->field_);
    bVar2 = Reflection::GetBool(this_00,b,this->field_);
    this_local._7_1_ = bVar1 < bVar2;
    break;
  case CPPTYPE_STRING:
    Reflection::GetString_abi_cxx11_((string *)((long)&second_5.field_2 + 8),this_00,a,this->field_)
    ;
    Reflection::GetString_abi_cxx11_((string *)local_a8,this_00,b,this->field_);
    this_local._7_1_ =
         std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&second_5.field_2 + 8),
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)(second_5.field_2._M_local_buf + 8));
  }
  return this_local._7_1_;
}

Assistant:

bool operator()(const Message* a, const Message* b) {
    const Reflection* reflection = a->GetReflection();
    switch (field_->cpp_type()) {
      case FieldDescriptor::CPPTYPE_BOOL: {
        bool first = reflection->GetBool(*a, field_);
        bool second = reflection->GetBool(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_INT32: {
        int32_t first = reflection->GetInt32(*a, field_);
        int32_t second = reflection->GetInt32(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_INT64: {
        int64_t first = reflection->GetInt64(*a, field_);
        int64_t second = reflection->GetInt64(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_UINT32: {
        uint32_t first = reflection->GetUInt32(*a, field_);
        uint32_t second = reflection->GetUInt32(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_UINT64: {
        uint64_t first = reflection->GetUInt64(*a, field_);
        uint64_t second = reflection->GetUInt64(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_STRING: {
        std::string first = reflection->GetString(*a, field_);
        std::string second = reflection->GetString(*b, field_);
        return first < second;
      }
      default:
        GOOGLE_LOG(DFATAL) << "Invalid key for map field.";
        return true;
    }
  }